

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.cpp
# Opt level: O3

unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_> __thiscall
verilogAST::Transformer::visit
          (Transformer *this,
          unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_> *node)

{
  long *plVar1;
  pointer ppVar2;
  long lVar3;
  long *in_RDX;
  long lVar4;
  pointer *__ptr;
  _Head_base<0UL,_verilogAST::Expression_*,_false> _Var5;
  _Head_base<0UL,_verilogAST::Expression_*,_false> _Var6;
  vector<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
  new_outer_dims;
  vector<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
  local_b8;
  Node *local_a0;
  _func_int **local_98;
  _Head_base<0UL,_verilogAST::Expression_*,_false> local_90;
  Node local_88;
  long *local_80;
  long *local_78;
  long *local_70;
  vector<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
  local_68;
  long local_48;
  _Head_base<0UL,_verilogAST::Vector_*,_false> local_40;
  long *local_38;
  
  local_70 = *(long **)(*in_RDX + 8);
  *(undefined8 *)(*in_RDX + 8) = 0;
  (*(code *)(((node->_M_t).
              super___uniq_ptr_impl<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>.
              _M_t.
              super__Tuple_impl<0UL,_verilogAST::Vector_*,_std::default_delete<verilogAST::Vector>_>
              .super__Head_base<0UL,_verilogAST::Vector_*,_false>._M_head_impl)->msb)._M_t.
            super___uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>
  )(&local_b8);
  ppVar2 = local_b8.
           super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_b8.
  super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  plVar1 = *(long **)(*in_RDX + 8);
  ((__uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> *)
  (*in_RDX + 8))->_M_t =
       (tuple<verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>)ppVar2;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x10))();
    if ((_Head_base<0UL,_verilogAST::Expression_*,_false>)
        local_b8.
        super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (_Head_base<0UL,_verilogAST::Expression_*,_false>)0x0) {
      (*((Node *)&(local_b8.
                   super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->first)->_vptr_Node[2])();
    }
  }
  local_b8.
  super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (local_70 != (long *)0x0) {
    (**(code **)(*local_70 + 0x10))();
  }
  local_70 = (long *)0x0;
  local_78 = *(long **)(*in_RDX + 0x10);
  *(undefined8 *)(*in_RDX + 0x10) = 0;
  (*(code *)(((node->_M_t).
              super___uniq_ptr_impl<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>.
              _M_t.
              super__Tuple_impl<0UL,_verilogAST::Vector_*,_std::default_delete<verilogAST::Vector>_>
              .super__Head_base<0UL,_verilogAST::Vector_*,_false>._M_head_impl)->super_Node).
            _vptr_Node)(&local_b8,node);
  ppVar2 = local_b8.
           super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_b8.
  super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  plVar1 = *(long **)(*in_RDX + 0x10);
  ((tuple<verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_> *)(*in_RDX + 0x10)
  )->super__Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>
       = (_Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>)
         ppVar2;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x10))();
    if ((_Head_base<0UL,_verilogAST::Expression_*,_false>)
        local_b8.
        super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (_Head_base<0UL,_verilogAST::Expression_*,_false>)0x0) {
      (*((Node *)&(local_b8.
                   super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->first)->_vptr_Node[2])();
    }
  }
  local_b8.
  super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (local_78 != (long *)0x0) {
    (**(code **)(*local_78 + 0x10))();
  }
  local_78 = (long *)0x0;
  local_80 = *(long **)(*in_RDX + 0x18);
  *(undefined8 *)(*in_RDX + 0x18) = 0;
  (*(code *)(((node->_M_t).
              super___uniq_ptr_impl<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>.
              _M_t.
              super__Tuple_impl<0UL,_verilogAST::Vector_*,_std::default_delete<verilogAST::Vector>_>
              .super__Head_base<0UL,_verilogAST::Vector_*,_false>._M_head_impl)->super_Node).
            _vptr_Node)(&local_b8,node);
  ppVar2 = local_b8.
           super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_b8.
  super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  plVar1 = *(long **)(*in_RDX + 0x18);
  ((tuple<verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_> *)(*in_RDX + 0x18)
  )->super__Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>
       = (_Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>)
         ppVar2;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x10))();
    if ((_Head_base<0UL,_verilogAST::Expression_*,_false>)
        local_b8.
        super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (_Head_base<0UL,_verilogAST::Expression_*,_false>)0x0) {
      (*((Node *)&(local_b8.
                   super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->first)->_vptr_Node[2])();
    }
  }
  local_b8.
  super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (local_80 != (long *)0x0) {
    (**(code **)(*local_80 + 0x10))();
  }
  local_80 = (long *)0x0;
  lVar4 = *in_RDX;
  if (lVar4 != 0) {
    lVar3 = __dynamic_cast(lVar4,&Vector::typeinfo,&NDVector::typeinfo,0);
    if (lVar3 != 0) {
      local_68.
      super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.
      super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.
      super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      _Var5._M_head_impl = *(Expression **)(lVar3 + 0x20);
      _Var6._M_head_impl = *(Expression **)(lVar3 + 0x28);
      if (_Var5._M_head_impl == _Var6._M_head_impl) {
        local_68.
        super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_68.
        super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
        local_68.
        super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
        local_68.
        super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
        local_68.
        super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
      }
      else {
        local_48 = lVar3;
        local_40._M_head_impl = (Vector *)this;
        local_38 = in_RDX;
        do {
          local_88._vptr_Node = ((_Var5._M_head_impl)->super_Node)._vptr_Node;
          ((_Var5._M_head_impl)->super_Node)._vptr_Node = (_func_int **)0x0;
          (*(code *)(((node->_M_t).
                      super___uniq_ptr_impl<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_verilogAST::Vector_*,_std::default_delete<verilogAST::Vector>_>
                      .super__Head_base<0UL,_verilogAST::Vector_*,_false>._M_head_impl)->super_Node)
                    ._vptr_Node)(&local_a0,node,&local_88);
          local_98 = _Var5._M_head_impl[1].super_Node._vptr_Node;
          _Var5._M_head_impl[1].super_Node._vptr_Node = (_func_int **)0x0;
          (*(code *)(((node->_M_t).
                      super___uniq_ptr_impl<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_verilogAST::Vector_*,_std::default_delete<verilogAST::Vector>_>
                      .super__Head_base<0UL,_verilogAST::Vector_*,_false>._M_head_impl)->super_Node)
                    ._vptr_Node)(&local_90,node,&local_98);
          local_b8.
          super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)local_a0;
          local_a0 = (Node *)0x0;
          local_b8.
          super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_90._M_head_impl;
          local_90._M_head_impl = (Expression *)0x0;
          std::
          vector<std::pair<std::unique_ptr<verilogAST::Expression,std::default_delete<verilogAST::Expression>>,std::unique_ptr<verilogAST::Expression,std::default_delete<verilogAST::Expression>>>,std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,std::default_delete<verilogAST::Expression>>,std::unique_ptr<verilogAST::Expression,std::default_delete<verilogAST::Expression>>>>>
          ::
          emplace_back<std::pair<std::unique_ptr<verilogAST::Expression,std::default_delete<verilogAST::Expression>>,std::unique_ptr<verilogAST::Expression,std::default_delete<verilogAST::Expression>>>>
                    ((vector<std::pair<std::unique_ptr<verilogAST::Expression,std::default_delete<verilogAST::Expression>>,std::unique_ptr<verilogAST::Expression,std::default_delete<verilogAST::Expression>>>,std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,std::default_delete<verilogAST::Expression>>,std::unique_ptr<verilogAST::Expression,std::default_delete<verilogAST::Expression>>>>>
                      *)&local_68,
                     (pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>
                      *)&local_b8);
          if ((_Head_base<0UL,_verilogAST::Expression_*,_false>)
              local_b8.
              super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              (_Head_base<0UL,_verilogAST::Expression_*,_false>)0x0) {
            (*((Node *)&(local_b8.
                         super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->first)->_vptr_Node[2])();
          }
          local_b8.
          super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          if ((_Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>
               )local_b8.
                super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (Expression *)0x0) {
            (**(code **)(*(long *)local_b8.
                                  super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 0x10))();
          }
          local_b8.
          super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          if (local_90._M_head_impl != (Expression *)0x0) {
            (*((local_90._M_head_impl)->super_Node)._vptr_Node[2])();
          }
          local_90._M_head_impl = (Expression *)0x0;
          if (local_98 != (_func_int **)0x0) {
            (**(code **)(*local_98 + 0x10))();
          }
          local_98 = (_func_int **)0x0;
          if (local_a0 != (Node *)0x0) {
            (*local_a0->_vptr_Node[2])();
          }
          local_a0 = (Node *)0x0;
          if (local_88._vptr_Node != (_func_int **)0x0) {
            (**(code **)(*local_88._vptr_Node + 0x10))();
          }
          local_88._vptr_Node = (_func_int **)0x0;
          _Var5._M_head_impl = _Var5._M_head_impl + 2;
        } while (_Var5._M_head_impl != _Var6._M_head_impl);
        _Var5._M_head_impl =
             ((_Head_base<0UL,_verilogAST::Expression_*,_false> *)(local_48 + 0x20))->_M_head_impl;
        _Var6._M_head_impl =
             ((_Head_base<0UL,_verilogAST::Expression_*,_false> *)(local_48 + 0x28))->_M_head_impl;
        lVar3 = local_48;
        this = (Transformer *)local_40._M_head_impl;
        in_RDX = local_38;
      }
      local_b8.
      super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)(lVar3 + 0x30);
      *(undefined4 *)(lVar3 + 0x20) =
           local_68.
           super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start._0_4_;
      *(undefined4 *)(lVar3 + 0x24) =
           local_68.
           super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start._4_4_;
      *(undefined4 *)(lVar3 + 0x28) =
           local_68.
           super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish._0_4_;
      *(undefined4 *)(lVar3 + 0x2c) =
           local_68.
           super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish._4_4_;
      *(pointer *)(lVar3 + 0x30) =
           local_68.
           super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_68.
      super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.
      super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.
      super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_b8.
      super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)_Var5._M_head_impl;
      local_b8.
      super__Vector_base<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)_Var6._M_head_impl;
      std::
      vector<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
      ::~vector(&local_b8);
      std::
      vector<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>,_std::allocator<std::pair<std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>,_std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>_>_>_>
      ::~vector(&local_68);
      lVar4 = *in_RDX;
    }
  }
  *this = (Transformer)lVar4;
  *in_RDX = 0;
  return (__uniq_ptr_data<verilogAST::Vector,_std::default_delete<verilogAST::Vector>,_true,_true>)
         (tuple<verilogAST::Vector_*,_std::default_delete<verilogAST::Vector>_>)this;
}

Assistant:

std::unique_ptr<Vector> Transformer::visit(std::unique_ptr<Vector> node) {
  node->id = this->visit(std::move(node->id));
  node->msb = this->visit(std::move(node->msb));
  node->lsb = this->visit(std::move(node->lsb));
  if (auto ptr = dynamic_cast<NDVector*>(node.get())) {
    std::vector<
        std::pair<std::unique_ptr<Expression>, std::unique_ptr<Expression>>>
        new_outer_dims;
    for (auto& dim : ptr->outer_dims) {
      new_outer_dims.push_back({this->visit(std::move(dim.first)),
                                this->visit(std::move(dim.second))});
    }
    ptr->outer_dims = std::move(new_outer_dims);
  }
  return node;
}